

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkNodeSupport(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pNode;
  int local_2c;
  int i;
  Vec_Ptr_t *vNodes;
  int nNodes_local;
  Abc_Obj_t **ppNodes_local;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_2c = 0; local_2c < nNodes; local_2c = local_2c + 1) {
    iVar1 = Abc_ObjIsCo(ppNodes[local_2c]);
    if (iVar1 == 0) {
      Abc_NtkNodeSupport_rec(ppNodes[local_2c],vNodes_00);
    }
    else {
      pNode = Abc_ObjFanin0(ppNodes[local_2c]);
      Abc_NtkNodeSupport_rec(pNode,vNodes_00);
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Abc_NtkNodeSupport( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    for ( i = 0; i < nNodes; i++ )
        if ( Abc_ObjIsCo(ppNodes[i]) )
            Abc_NtkNodeSupport_rec( Abc_ObjFanin0(ppNodes[i]), vNodes );
        else
            Abc_NtkNodeSupport_rec( ppNodes[i], vNodes );
    return vNodes;
}